

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O1

int bucket_remove(bucket b,comparable_callback compare_cb,void *key,void **value)

{
  pair ppVar1;
  void *pvVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int unaff_EBX;
  ulong new_capacity;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if ((compare_cb == (comparable_callback)0x0 || b == (bucket)0x0) || key == (void *)0x0) {
    pcVar8 = "Invalid bucket remove parameters";
    uVar7 = 0x115;
  }
  else {
    if ((b->pairs != (pair)0x0) && (b->count != 0)) {
      if (b->count == 0) {
        return 1;
      }
      lVar10 = -1;
      lVar11 = 0;
      uVar9 = 0;
      while( true ) {
        ppVar1 = b->pairs;
        iVar4 = (*compare_cb)(key,*(comparable *)((long)&ppVar1->key + lVar11));
        if (iVar4 == 0) {
          pvVar2 = *(void **)((long)&ppVar1->value + lVar11);
          uVar3 = b->capacity;
          new_capacity = uVar3 >> 1;
          memmove((void *)((long)&ppVar1->key + lVar11),(void *)((long)&b->pairs[1].key + lVar11),
                  (b->count + lVar10) * 0x10);
          uVar6 = b->count - 1;
          b->count = uVar6;
          if ((uVar3 < 10 || new_capacity < uVar6) ||
             (iVar5 = bucket_realloc_pairs(b,new_capacity), iVar5 == 0)) {
            unaff_EBX = 0;
            if (value != (void **)0x0) {
              *value = pvVar2;
            }
          }
          else {
            log_write_impl_va("metacall",0x133,"bucket_remove",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                              ,3,"Invalid bucket remove pairs reallocation");
            unaff_EBX = 1;
          }
        }
        if (iVar4 == 0) break;
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x10;
        lVar10 = lVar10 + -1;
        if (b->count <= uVar9) {
          return 1;
        }
      }
      return unaff_EBX;
    }
    pcVar8 = "Invalid bucket remove pairs";
    uVar7 = 0x11b;
  }
  log_write_impl_va("metacall",uVar7,"bucket_remove",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,3,pcVar8);
  return 1;
}

Assistant:

int bucket_remove(bucket b, comparable_callback compare_cb, void *key, void **value)
{
	size_t iterator;

	if (b == NULL || compare_cb == NULL || key == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove parameters");
		return 1;
	}

	if (b->pairs == NULL || b->count == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs");
		return 1;
	}

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			void *deleted_value = p->value;

			size_t next = iterator + 1;

			size_t new_capacity = b->capacity >> 1;

			memmove(p, &b->pairs[next], sizeof(struct pair_type) * (b->count - next));

			--b->count;

			if (b->count <= new_capacity && new_capacity > BUCKET_PAIRS_DEFAULT)
			{
				if (bucket_realloc_pairs(b, new_capacity) != 0)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket remove pairs reallocation");
					return 1;
				}
			}

			if (value != NULL)
			{
				*value = deleted_value;
			}

			return 0;
		}
	}

	return 1;
}